

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O2

void de::anon_unknown_0::singleThreadRemoveTest(WaitMode mode)

{
  SpinBarrier barrier;
  
  SpinBarrier::SpinBarrier(&barrier,3);
  SpinBarrier::removeThread(&barrier,mode);
  SpinBarrier::removeThread(&barrier,mode);
  SpinBarrier::sync(&barrier);
  SpinBarrier::removeThread(&barrier,mode);
  barrier.m_numThreads = 1;
  barrier.m_numEntered = 0;
  barrier.m_numLeaving = 0;
  barrier.m_numRemoved = 0;
  SpinBarrier::sync(&barrier);
  barrier.m_numThreads = 2;
  barrier.m_numEntered = 0;
  barrier.m_numLeaving = 0;
  barrier.m_numRemoved = 0;
  SpinBarrier::removeThread(&barrier,mode);
  SpinBarrier::sync(&barrier);
  return;
}

Assistant:

void singleThreadRemoveTest (SpinBarrier::WaitMode mode)
{
	SpinBarrier barrier(3);

	barrier.removeThread(mode);
	barrier.removeThread(mode);
	barrier.sync(mode);
	barrier.removeThread(mode);

	barrier.reset(1);
	barrier.sync(mode);

	barrier.reset(2);
	barrier.removeThread(mode);
	barrier.sync(mode);
}